

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_unique_ptr.cpp
# Opt level: O2

void __thiscall TestA::TestA(TestA *this)

{
  ostream *poVar1;
  
  (this->m_TestB_Ptr).super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_TestB_Ptr).super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  poVar1 = std::operator<<((ostream *)&std::cout,"TestA()");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

TestA()
	{
		std::cout << "TestA()" << std::endl;
	}